

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O2

CURLcode Curl_shuffle_addr(Curl_easy *data,Curl_addrinfo **addr)

{
  undefined8 uVar1;
  uint uVar2;
  CURLcode CVar3;
  undefined8 *puVar4;
  ulong uVar5;
  uchar *rnd;
  uint uVar6;
  ulong uVar7;
  
  uVar2 = Curl_num_addresses(*addr);
  CVar3 = CURLE_OK;
  if (1 < (int)uVar2) {
    Curl_infof(data,"Shuffling %i addresses",(ulong)uVar2);
    uVar7 = (ulong)uVar2;
    puVar4 = (undefined8 *)(*Curl_cmalloc)(uVar7 * 8);
    if (puVar4 == (undefined8 *)0x0) {
      CVar3 = CURLE_OUT_OF_MEMORY;
    }
    else {
      *puVar4 = *addr;
      for (uVar5 = 1; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        puVar4[uVar5] = *(undefined8 *)(puVar4[uVar5 - 1] + 0x28);
      }
      rnd = (uchar *)(*Curl_cmalloc)(uVar7 * 4);
      if (rnd == (uchar *)0x0) {
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        CVar3 = Curl_rand(data,rnd,uVar7 * 4);
        if (CVar3 == CURLE_OK) {
          uVar6 = uVar2 - 1;
          for (uVar5 = (ulong)uVar6; 0 < (long)uVar5; uVar5 = uVar5 - 1) {
            uVar1 = puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % (ulong)uVar2];
            puVar4[(ulong)*(uint *)(rnd + uVar5 * 4) % (ulong)uVar2] = puVar4[uVar5];
            puVar4[uVar5] = uVar1;
            uVar2 = uVar2 - 1;
          }
          for (uVar5 = 1; uVar7 != uVar5; uVar5 = uVar5 + 1) {
            *(undefined8 *)(puVar4[uVar5 - 1] + 0x28) = puVar4[uVar5];
          }
          *(undefined8 *)(puVar4[uVar6] + 0x28) = 0;
          *addr = (Curl_addrinfo *)*puVar4;
        }
        (*Curl_cfree)(rnd);
        CVar3 = CURLE_OK;
      }
      (*Curl_cfree)(puVar4);
    }
  }
  return CVar3;
}

Assistant:

CURLcode Curl_shuffle_addr(struct Curl_easy *data, Curl_addrinfo **addr)
{
  CURLcode result = CURLE_OK;
  const int num_addrs = Curl_num_addresses(*addr);

  if(num_addrs > 1) {
    Curl_addrinfo **nodes;
    infof(data, "Shuffling %i addresses", num_addrs);

    nodes = malloc(num_addrs*sizeof(*nodes));
    if(nodes) {
      int i;
      unsigned int *rnd;
      const size_t rnd_size = num_addrs * sizeof(*rnd);

      /* build a plain array of Curl_addrinfo pointers */
      nodes[0] = *addr;
      for(i = 1; i < num_addrs; i++) {
        nodes[i] = nodes[i-1]->ai_next;
      }

      rnd = malloc(rnd_size);
      if(rnd) {
        /* Fisher-Yates shuffle */
        if(Curl_rand(data, (unsigned char *)rnd, rnd_size) == CURLE_OK) {
          Curl_addrinfo *swap_tmp;
          for(i = num_addrs - 1; i > 0; i--) {
            swap_tmp = nodes[rnd[i] % (i + 1)];
            nodes[rnd[i] % (i + 1)] = nodes[i];
            nodes[i] = swap_tmp;
          }

          /* relink list in the new order */
          for(i = 1; i < num_addrs; i++) {
            nodes[i-1]->ai_next = nodes[i];
          }

          nodes[num_addrs-1]->ai_next = NULL;
          *addr = nodes[0];
        }
        free(rnd);
      }
      else
        result = CURLE_OUT_OF_MEMORY;
      free(nodes);
    }
    else
      result = CURLE_OUT_OF_MEMORY;
  }
  return result;
}